

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmState.cxx
# Opt level: O2

bool cmState::IsCacheEntryType(string *key)

{
  char *__rhs;
  bool bVar1;
  char **ppcVar2;
  
  ppcVar2 = cmCacheEntryTypes;
  do {
    __rhs = *ppcVar2;
    if (__rhs == (char *)0x0) break;
    bVar1 = std::operator==(key,__rhs);
    ppcVar2 = ppcVar2 + 1;
  } while (!bVar1);
  return __rhs != (char *)0x0;
}

Assistant:

bool cmState::IsCacheEntryType(std::string const& key)
{
  for (int i = 0; cmCacheEntryTypes[i]; ++i) {
    if (key == cmCacheEntryTypes[i]) {
      return true;
    }
  }
  return false;
}